

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<char_const(&)[3],kj::StringTree,char_const(&)[12],kj::StringTree,char_const(&)[11],kj::StringTree,char_const(&)[24],kj::StringTree,char_const(&)[27]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],StringTree *params_1,
          char (*params_2) [12],StringTree *params_3,char (*params_4) [11],StringTree *params_5,
          char (*params_6) [24],StringTree *params_7,char (*params_8) [27])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  undefined1 local_80 [24];
  ArrayDisposer *local_68;
  Branch *local_60;
  char *local_58;
  StringTree *local_50;
  ArrayDisposer *local_48;
  Branch *local_40;
  ArrayDisposer *local_38;
  
  local_38 = (ArrayDisposer *)strlen((char *)this);
  local_40 = (Branch *)this;
  local_48 = (ArrayDisposer *)strlen((char *)params_1);
  local_50 = params_1;
  local_58 = (char *)strlen((char *)params_3);
  local_60 = (Branch *)params_3;
  local_68 = (ArrayDisposer *)strlen((char *)params_5);
  local_80._16_8_ = params_5;
  local_80._8_8_ = strlen((char *)params_7);
  local_80._0_8_ = params_7;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_40,(ArrayPtr<const_char> *)params,
             (StringTree *)&local_50,(ArrayPtr<const_char> *)params_2,(StringTree *)&local_60,
             (ArrayPtr<const_char> *)params_4,(StringTree *)(local_80 + 0x10),
             (ArrayPtr<const_char> *)params_6,(StringTree *)local_80,in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}